

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O3

unsigned_long __thiscall protozero::pbf_reader::get_varint<unsigned_long>(pbf_reader *this)

{
  byte bVar1;
  uint uVar2;
  unsigned_long uVar3;
  undefined8 *puVar4;
  uint64_t val;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  pointer_____offset_0x10___ *ppuVar8;
  ulong uVar9;
  
  pbVar7 = (byte *)this->m_data;
  pbVar6 = (byte *)this->m_end;
  if ((pbVar7 != pbVar6) && (bVar5 = *pbVar7, -1 < (long)(char)bVar5)) {
    this->m_data = (char *)(pbVar7 + 1);
    return (long)(char)bVar5;
  }
  pbVar7 = (byte *)this->m_data;
  if (9 < (long)pbVar6 - (long)pbVar7) {
    uVar2 = *pbVar7 & 0x7f;
    uVar3 = (unsigned_long)uVar2;
    if ((char)*pbVar7 < '\0') {
      uVar2 = uVar2 | (pbVar7[1] & 0x7f) << 7;
      uVar3 = (unsigned_long)uVar2;
      if ((char)pbVar7[1] < '\0') {
        uVar2 = uVar2 | (pbVar7[2] & 0x7f) << 0xe;
        uVar3 = (unsigned_long)uVar2;
        if ((char)pbVar7[2] < '\0') {
          uVar3 = (unsigned_long)(uVar2 | (pbVar7[3] & 0x7f) << 0x15);
          if ((char)pbVar7[3] < '\0') {
            uVar3 = uVar3 | (ulong)(pbVar7[4] & 0x7f) << 0x1c;
            if ((char)pbVar7[4] < '\0') {
              uVar3 = uVar3 | (ulong)(pbVar7[5] & 0x7f) << 0x23;
              if ((char)pbVar7[5] < '\0') {
                uVar3 = uVar3 | (ulong)(pbVar7[6] & 0x7f) << 0x2a;
                if ((char)pbVar7[6] < '\0') {
                  uVar3 = uVar3 | (ulong)(pbVar7[7] & 0x7f) << 0x31;
                  if ((char)pbVar7[7] < '\0') {
                    pbVar6 = pbVar7 + 9;
                    uVar3 = uVar3 | (ulong)(pbVar7[8] & 0x7f) << 0x38;
                    if ((char)pbVar7[8] < '\0') {
                      if ((long)(char)*pbVar6 < 0) {
                        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar4 = &PTR__exception_002571a8;
                        ppuVar8 = &varint_too_long_exception::typeinfo;
                        goto LAB_00167596;
                      }
                      uVar3 = uVar3 | (long)(char)*pbVar6 << 0x3f;
                      pbVar6 = pbVar7 + 10;
                    }
                  }
                  else {
                    pbVar6 = pbVar7 + 8;
                  }
                }
                else {
                  pbVar6 = pbVar7 + 7;
                }
              }
              else {
                pbVar6 = pbVar7 + 6;
              }
            }
            else {
              pbVar6 = pbVar7 + 5;
            }
          }
          else {
            pbVar6 = pbVar7 + 4;
          }
        }
        else {
          pbVar6 = pbVar7 + 3;
        }
      }
      else {
        pbVar6 = pbVar7 + 2;
      }
    }
    else {
LAB_001675ab:
      pbVar6 = pbVar7 + 1;
    }
    this->m_data = (char *)pbVar6;
    return uVar3;
  }
  if (pbVar7 != pbVar6) {
    bVar5 = 0;
    uVar9 = 0;
    do {
      bVar1 = *pbVar7;
      if (-1 < (char)bVar1) {
        uVar3 = (ulong)bVar1 << (bVar5 & 0x3f) | uVar9;
        goto LAB_001675ab;
      }
      pbVar7 = pbVar7 + 1;
      uVar9 = uVar9 | (ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f);
      bVar5 = bVar5 + 7;
    } while (pbVar7 != pbVar6);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_002571d0;
  ppuVar8 = &end_of_buffer_exception::typeinfo;
LAB_00167596:
  __cxa_throw(puVar4,ppuVar8,std::exception::~exception);
}

Assistant:

inline uint64_t decode_varint(const char** data, const char* end) {
    // If this is a one-byte varint, decode it here.
    if (end != *data && ((static_cast<uint64_t>(**data) & 0x80U) == 0)) {
        const auto val = static_cast<uint64_t>(**data);
        ++(*data);
        return val;
    }
    // If this varint is more than one byte, defer to complete implementation.
    return detail::decode_varint_impl(data, end);
}